

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall mir::inst::Variable::Variable(Variable *this,Variable *param_2)

{
  shared_ptr<mir::types::Ty> *in_RSI;
  shared_ptr<mir::types::Ty> *in_RDI;
  
  prelude::Displayable::Displayable((Displayable *)in_RDI,(Displayable *)in_RSI);
  (in_RDI->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_display_0036ffc0;
  std::shared_ptr<mir::types::Ty>::shared_ptr(in_RSI,in_RDI);
  in_RDI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RSI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  return;
}

Assistant:

Variable() {
    is_memory_var = false;
    is_temp_var = false;
    is_phi_var = false;
  }